

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cc
# Opt level: O0

int main(void)

{
  TemplateString local_178;
  undefined1 local_158 [8];
  PerExpandData data;
  string local_128 [8];
  string nothing_will_come_of_nothing;
  TemplateString local_108;
  TemplateDictionary local_e8 [8];
  TemplateDictionary dict;
  TemplateString local_78;
  Template *local_58;
  Template *tpl;
  TemplateString local_30;
  int local_c;
  
  local_c = 0;
  ctemplate::TemplateString::TemplateString(&local_30,"key");
  ctemplate::TemplateString::TemplateString((TemplateString *)&tpl,"example");
  ctemplate::Template::StringToTemplateCache(&local_30,(TemplateString *)&tpl);
  ctemplate::TemplateString::TemplateString(&local_78,"key");
  local_58 = (Template *)ctemplate::Template::GetTemplate(&local_78,DO_NOT_STRIP);
  ctemplate::TemplateString::TemplateString(&local_108,"my dict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_e8,&local_108,(UnsafeArena *)0x0);
  std::__cxx11::string::string(local_128);
  ctemplate::Template::Expand(local_58,(string *)local_128,(TemplateDictionaryInterface *)local_e8);
  ctemplate::PerExpandData::PerExpandData((PerExpandData *)local_158);
  std::__cxx11::string::clear();
  ctemplate::TemplateString::TemplateString(&local_178,"key");
  ctemplate::ExpandWithData
            (&local_178,DO_NOT_STRIP,(TemplateDictionaryInterface *)local_e8,
             (PerExpandData *)local_158,(string *)local_128);
  printf("PASS.\n");
  local_c = 0;
  ctemplate::PerExpandData::~PerExpandData((PerExpandData *)local_158);
  std::__cxx11::string::~string(local_128);
  ctemplate::TemplateDictionary::~TemplateDictionary(local_e8);
  return local_c;
}

Assistant:

int main() {
  template_ns::Template::StringToTemplateCache("key", "example");
  template_ns::Template* tpl = template_ns::Template::GetTemplate(
      "key", template_ns::DO_NOT_STRIP);
  template_ns::TemplateDictionary dict("my dict");
  std::string nothing_will_come_of_nothing;
  tpl->Expand(&nothing_will_come_of_nothing, &dict);

  // Try using a bit more functionality.
  template_ns::PerExpandData data;
  nothing_will_come_of_nothing.clear();
  template_ns::ExpandWithData("key", template_ns::DO_NOT_STRIP, &dict, &data,
                              &nothing_will_come_of_nothing);

  printf("PASS.\n");
  return 0;
}